

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

ReturnAction<ot::commissioner::Error> __thiscall
testing::Return<ot::commissioner::Error>(testing *this,Error *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ReturnAction<ot::commissioner::Error> RVar4;
  Error local_38;
  
  local_38.mCode = value->mCode;
  paVar2 = &local_38.mMessage.field_2;
  local_38.mMessage._M_dataplus._M_p = (value->mMessage)._M_dataplus._M_p;
  paVar1 = &(value->mMessage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.mMessage._M_dataplus._M_p == paVar1) {
    local_38.mMessage.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.mMessage.field_2._8_8_ = *(undefined8 *)((long)&(value->mMessage).field_2 + 8);
    local_38.mMessage._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_38.mMessage.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38.mMessage._M_string_length = (value->mMessage)._M_string_length;
  (value->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (value->mMessage)._M_string_length = 0;
  (value->mMessage).field_2._M_local_buf[0] = '\0';
  internal::ReturnAction<ot::commissioner::Error>::ReturnAction
            ((ReturnAction<ot::commissioner::Error> *)this,&local_38);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.mMessage._M_dataplus._M_p != paVar2) {
    operator_delete(local_38.mMessage._M_dataplus._M_p);
    _Var3._M_pi = extraout_RDX_00;
  }
  RVar4.value_.super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  RVar4.value_.super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ReturnAction<ot::commissioner::Error>)
         RVar4.value_.super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}